

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase_tests.cpp
# Opt level: O1

void __thiscall netbase_tests::netbase_lookupnumeric::test_method(netbase_lookupnumeric *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  check_type cVar3;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  lazy_ostream local_2d0;
  undefined1 *local_2c0;
  char **local_2b8;
  assertion_result local_2b0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x81;
  file.m_begin = (iterator)&local_288;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_298,msg);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"127.0.0.1","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"127.0.0.1:65535","");
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_58,&local_78);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e0 = "TestParse(\"127.0.0.1\", \"127.0.0.1:65535\")";
  local_2d8 = "";
  local_2d0.m_empty = false;
  local_2d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_2c0 = boost::unit_test::lazy_ostream::inst;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_2e8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_2b8 = &local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d0,1,0,WARN,_cVar3,(size_t)&local_2f0,0x81);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x82;
  file_00.m_begin = (iterator)&local_300;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_310,
             msg_00);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"127.0.0.1:8333","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"127.0.0.1:8333","");
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_98,&local_b8);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e0 = "TestParse(\"127.0.0.1:8333\", \"127.0.0.1:8333\")";
  local_2d8 = "";
  local_2d0.m_empty = false;
  local_2d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_2c0 = boost::unit_test::lazy_ostream::inst;
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_318 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_2b8 = &local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d0,1,0,WARN,_cVar3,(size_t)&local_320,0x82);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x83;
  file_01.m_begin = (iterator)&local_330;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_340,
             msg_01);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"::ffff:127.0.0.1","");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"127.0.0.1:65535","");
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_d8,&local_f8);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e0 = "TestParse(\"::ffff:127.0.0.1\", \"127.0.0.1:65535\")";
  local_2d8 = "";
  local_2d0.m_empty = false;
  local_2d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_2c0 = boost::unit_test::lazy_ostream::inst;
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_348 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_2b8 = &local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d0,1,0,WARN,_cVar3,(size_t)&local_350,0x83);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x84;
  file_02.m_begin = (iterator)&local_360;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_370,
             msg_02);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"::","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"[::]:65535","");
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_118,&local_138);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e0 = "TestParse(\"::\", \"[::]:65535\")";
  local_2d8 = "";
  local_2d0.m_empty = false;
  local_2d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_2c0 = boost::unit_test::lazy_ostream::inst;
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_378 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_2b8 = &local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d0,1,0,WARN,_cVar3,(size_t)&local_380,0x84);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x85;
  file_03.m_begin = (iterator)&local_390;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3a0,
             msg_03);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"[::]:8333","");
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"[::]:8333","");
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_158,&local_178);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e0 = "TestParse(\"[::]:8333\", \"[::]:8333\")";
  local_2d8 = "";
  local_2d0.m_empty = false;
  local_2d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_2c0 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3a8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_2b8 = &local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d0,1,0,WARN,_cVar3,(size_t)&local_3b0,0x85);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x86;
  file_04.m_begin = (iterator)&local_3c0;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3d0,
             msg_04);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"[127.0.0.1]","");
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"127.0.0.1:65535","");
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_198,&local_1b8);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e0 = "TestParse(\"[127.0.0.1]\", \"127.0.0.1:65535\")";
  local_2d8 = "";
  local_2d0.m_empty = false;
  local_2d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_2c0 = boost::unit_test::lazy_ostream::inst;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3d8 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_2b8 = &local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d0,1,0,WARN,_cVar3,(size_t)&local_3e0,0x86);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x87;
  file_05.m_begin = (iterator)&local_3f0;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_400,
             msg_05);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,":::","");
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"[::]:0","");
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_1d8,&local_1f8);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e0 = "TestParse(\":::\", \"[::]:0\")";
  local_2d8 = "";
  local_2d0.m_empty = false;
  local_2d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_2c0 = boost::unit_test::lazy_ostream::inst;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_408 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_2b8 = &local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d0,1,0,WARN,_cVar3,(size_t)&local_410,0x87);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x8a;
  file_06.m_begin = (iterator)&local_420;
  msg_06.m_end = pvVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_430,
             msg_06);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"[fd6b:88c0:8724:1:2:3:4:5]","");
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"[::]:0","");
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_218,&local_238);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e0 = "TestParse(\"[fd6b:88c0:8724:1:2:3:4:5]\", \"[::]:0\")";
  local_2d8 = "";
  local_2d0.m_empty = false;
  local_2d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_2c0 = boost::unit_test::lazy_ostream::inst;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_438 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_2b8 = &local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d0,1,0,WARN,_cVar3,(size_t)&local_440,0x8a);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/netbase_tests.cpp";
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x8c;
  file_07.m_begin = (iterator)&local_450;
  msg_07.m_end = pvVar2;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_460,
             msg_07);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"[fd6c:88c0:8724:1:2:3:4:5]","");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,"[fd6c:88c0:8724:1:2:3:4:5]:65535","");
  local_2b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)TestParse(&local_258,&local_278);
  local_2b0.m_message.px = (element_type *)0x0;
  local_2b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_2e0 = "TestParse(\"[fd6c:88c0:8724:1:2:3:4:5]\", \"[fd6c:88c0:8724:1:2:3:4:5]:65535\")";
  local_2d8 = "";
  local_2d0.m_empty = false;
  local_2d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_2c0 = boost::unit_test::lazy_ostream::inst;
  local_2b8 = &local_2e0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2b0,&local_2d0,1,0,WARN,0xee081d,(size_t)&stack0xfffffffffffffb90,0x8c);
  boost::detail::shared_count::~shared_count(&local_2b0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(netbase_lookupnumeric)
{
    BOOST_CHECK(TestParse("127.0.0.1", "127.0.0.1:65535"));
    BOOST_CHECK(TestParse("127.0.0.1:8333", "127.0.0.1:8333"));
    BOOST_CHECK(TestParse("::ffff:127.0.0.1", "127.0.0.1:65535"));
    BOOST_CHECK(TestParse("::", "[::]:65535"));
    BOOST_CHECK(TestParse("[::]:8333", "[::]:8333"));
    BOOST_CHECK(TestParse("[127.0.0.1]", "127.0.0.1:65535"));
    BOOST_CHECK(TestParse(":::", "[::]:0"));

    // verify that an internal address fails to resolve
    BOOST_CHECK(TestParse("[fd6b:88c0:8724:1:2:3:4:5]", "[::]:0"));
    // and that a one-off resolves correctly
    BOOST_CHECK(TestParse("[fd6c:88c0:8724:1:2:3:4:5]", "[fd6c:88c0:8724:1:2:3:4:5]:65535"));
}